

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
int_writer<long_long,fmt::v6::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,wchar_t **it)

{
  wchar_t *pwVar1;
  undefined8 *in_RSI;
  long in_RDI;
  const_iterator group;
  int digit_index;
  basic_string_view<wchar_t> s;
  unsigned_long in_stack_00000088;
  wchar_t *in_stack_00000090;
  undefined1 in_stack_000000a0 [40];
  basic_string_view<wchar_t> local_20;
  undefined8 *local_10;
  
  local_10 = in_RSI;
  basic_string_view<wchar_t>::basic_string_view(&local_20,(wchar_t *)(in_RDI + 0x18),1);
  std::__cxx11::string::cbegin();
  pwVar1 = internal::operator()
                     (in_stack_00000090,in_stack_00000088,this._4_4_,
                      (anon_class_40_4_2c7d0318)in_stack_000000a0);
  *local_10 = pwVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
        basic_string_view<char_type> s(&sep, sep_size);
        // Index of a decimal digit with the least significant digit having
        // index 0.
        int digit_index = 0;
        std::string::const_iterator group = groups.cbegin();
        it = format_decimal<char_type>(
            it, abs_value, size,
            [this, s, &group, &digit_index](char_type*& buffer) {
              if (*group <= 0 || ++digit_index % *group != 0 ||
                  *group == max_value<char>())
                return;
              if (group + 1 != groups.cend()) {
                digit_index = 0;
                ++group;
              }
              buffer -= s.size();
              std::uninitialized_copy(s.data(), s.data() + s.size(),
                                      make_checked(buffer, s.size()));
            });
      }